

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O0

uint32_t volkGetInstanceVersion(void)

{
  VkResult VVar1;
  uint32_t local_10;
  uint32_t local_c;
  uint32_t apiVersion;
  
  local_10 = 0;
  if ((vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) &&
     (VVar1 = (*vkEnumerateInstanceVersion)(&local_10), VVar1 == VK_SUCCESS)) {
    return local_10;
  }
  if (vkCreateInstance == (PFN_vkCreateInstance)0x0) {
    local_c = 0;
  }
  else {
    local_c = 0x400000;
  }
  return local_c;
}

Assistant:

uint32_t volkGetInstanceVersion(void)
{
#if defined(VK_VERSION_1_1)
	uint32_t apiVersion = 0;
	if (vkEnumerateInstanceVersion && vkEnumerateInstanceVersion(&apiVersion) == VK_SUCCESS)
		return apiVersion;
#endif

	if (vkCreateInstance)
		return VK_API_VERSION_1_0;

	return 0;
}